

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcStair::IfcStair(IfcStair *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcStair";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00868e00);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x868cd0;
  *(undefined8 *)&this->field_0x178 = 0x868de8;
  *(undefined8 *)&this->field_0x88 = 0x868cf8;
  *(undefined8 *)&this->field_0x98 = 0x868d20;
  *(undefined8 *)&this->field_0xd0 = 0x868d48;
  *(undefined8 *)&this->field_0x100 = 0x868d70;
  *(undefined8 *)&this->field_0x138 = 0x868d98;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x868dc0;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcStair() : Object("IfcStair") {}